

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_object.c
# Opt level: O2

tnt_stream * tnt_object_as(tnt_stream *s,char *buf,size_t buf_len)

{
  undefined8 *puVar1;
  
  if ((s == (tnt_stream *)0x0) && (s = tnt_object((tnt_stream *)0x0), s == (tnt_stream *)0x0)) {
    return (tnt_stream *)0x0;
  }
  puVar1 = (undefined8 *)s->data;
  *puVar1 = buf;
  puVar1[1] = buf_len;
  puVar1[2] = buf_len;
  *(undefined4 *)(puVar1 + 7) = 1;
  return s;
}

Assistant:

struct tnt_stream *tnt_object_as(struct tnt_stream *s, char *buf,
				 size_t buf_len)
{
	if (s == NULL) {
		s = tnt_object(s);
		if (s == NULL)
			return NULL;
	}
	struct tnt_stream_buf *sb = TNT_SBUF_CAST(s);

	sb->data = buf;
	sb->size = buf_len;
	sb->alloc = buf_len;
	sb->as = 1;

	return s;
}